

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_code.hpp
# Opt level: O2

bool boost::system::operator==(error_code *code,error_condition *condition)

{
  int iVar1;
  
  iVar1 = (*code->m_cat->_vptr_error_category[5])(code->m_cat,(ulong)(uint)code->m_val,condition);
  if ((char)iVar1 != '\0') {
    return true;
  }
  iVar1 = (*condition->m_cat->_vptr_error_category[6])
                    (condition->m_cat,code,(ulong)(uint)condition->m_val);
  return SUB41(iVar1,0);
}

Assistant:

inline bool operator==( const error_code & code,
                            const error_condition & condition ) BOOST_SYSTEM_NOEXCEPT
    {
      return code.category().equivalent( code.value(), condition )
        || condition.category().equivalent( code, condition.value() );
    }